

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

local_iterator * __thiscall
google::
sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::begin(local_iterator *__return_storage_ptr__,
       sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *this,size_type i)

{
  Table *this_00;
  sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
  *psVar1;
  sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
  *psVar2;
  nonempty_iterator ppVar3;
  bool bVar4;
  nonempty_iterator *__return_storage_ptr___00;
  nonempty_iterator *__return_storage_ptr___01;
  nonempty_iterator nStack_a8;
  nonempty_iterator local_88;
  nonempty_iterator local_68;
  nonempty_iterator local_48;
  
  __return_storage_ptr___01 = &nStack_a8;
  this_00 = &this->table;
  bVar4 = sparsetable<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
          ::test(this_00,i);
  if (bVar4) {
    __return_storage_ptr___00 = &local_48;
    sparsetable<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
    ::get_iter(__return_storage_ptr___00,this_00,i);
    __return_storage_ptr___01 = &local_68;
  }
  else {
    __return_storage_ptr___00 = &local_88;
    sparsetable<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
    ::nonempty_end(__return_storage_ptr___00,this_00);
  }
  sparsetable<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
  ::nonempty_end(__return_storage_ptr___01,this_00);
  psVar1 = (__return_storage_ptr___01->row_begin)._M_current;
  psVar2 = (__return_storage_ptr___01->row_end)._M_current;
  ppVar3 = __return_storage_ptr___01->col_current;
  (__return_storage_ptr__->end).row_current._M_current =
       (__return_storage_ptr___01->row_current)._M_current;
  (__return_storage_ptr__->end).col_current = ppVar3;
  (__return_storage_ptr__->end).row_begin._M_current = psVar1;
  (__return_storage_ptr__->end).row_end._M_current = psVar2;
  psVar1 = (__return_storage_ptr___00->row_end)._M_current;
  psVar2 = (__return_storage_ptr___00->row_current)._M_current;
  ppVar3 = __return_storage_ptr___00->col_current;
  (__return_storage_ptr__->pos).row_begin._M_current =
       (__return_storage_ptr___00->row_begin)._M_current;
  (__return_storage_ptr__->pos).row_end._M_current = psVar1;
  (__return_storage_ptr__->pos).row_current._M_current = psVar2;
  (__return_storage_ptr__->pos).col_current = ppVar3;
  __return_storage_ptr__->ht = this;
  sparse_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

local_iterator begin(size_type i) {
    if (table.test(i))
      return local_iterator(this, table.get_iter(i), table.nonempty_end());
    else
      return local_iterator(this, table.nonempty_end(), table.nonempty_end());
  }